

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O0

void blend_a64_vmask_bn_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int w,int h,blend_unit_fn blend)

{
  byte bVar1;
  ushort uVar2;
  uint in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  uint in_ESI;
  long lVar3;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  __m128i v;
  byte *in_stack_00000008;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  int c;
  __m128i v_maxval_w;
  int local_bc;
  long local_98;
  long local_88;
  long local_78;
  ushort uStack_66;
  ushort uStack_64;
  
  local_98 = in_R8;
  local_88 = in_RDX;
  local_78 = in_RDI;
  do {
    bVar1 = *in_stack_00000008;
    uVar2 = (ushort)bVar1;
    uStack_66 = (ushort)bVar1;
    uStack_64 = (ushort)bVar1;
    for (local_bc = 0; local_bc < (int)v_res_w[0]; local_bc = local_bc + 8) {
      lVar3 = local_98 + (long)local_bc * 2;
      (*(code *)v_m1_w[0])
                ((ulong)CONCAT14(bVar1,(uint)CONCAT12(bVar1,uVar2)) | (ulong)uVar2 << 0x30,
                 CONCAT26(0x40 - uVar2,
                          CONCAT24(0x40 - uStack_64,CONCAT22(0x40 - uStack_66,0x40 - uVar2))),
                 local_88 + (long)local_bc * 2);
      v[1] = extraout_RDX;
      v[0] = lVar3;
      xx_storeu_128((void *)(local_78 + (long)local_bc * 2),v);
    }
    local_78 = local_78 + (ulong)in_ESI * 2;
    local_88 = local_88 + (ulong)in_ECX * 2;
    local_98 = local_98 + (ulong)in_R9D * 2;
    in_stack_00000008 = in_stack_00000008 + 1;
    v_res_w[1]._0_4_ = (int)v_res_w[1] + -1;
  } while ((int)v_res_w[1] != 0);
  return;
}

Assistant:

static inline void blend_a64_vmask_bn_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, int w, int h, blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);
    for (c = 0; c < w; c += 8) {
      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}